

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::addRelation
          (CollationBuilder *this,int32_t strength,UnicodeString *prefix,UnicodeString *str,
          UnicodeString *extension,char **parserErrorReason,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int64_t iVar4;
  uint32_t local_12c;
  undefined1 local_128 [4];
  uint32_t ce32;
  UnicodeString nfdExtension;
  int32_t cesLengthBeforeExtension;
  int32_t tempStrength;
  int64_t ce;
  int32_t index;
  undefined1 local_c8 [2];
  UChar c;
  int32_t nfdLength;
  UnicodeString nfdString;
  undefined1 local_78 [8];
  UnicodeString nfdPrefix;
  char **parserErrorReason_local;
  UnicodeString *extension_local;
  UnicodeString *str_local;
  UnicodeString *prefix_local;
  int32_t strength_local;
  CollationBuilder *this_local;
  
  nfdPrefix.fUnion._48_8_ = parserErrorReason;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return;
  }
  UnicodeString::UnicodeString((UnicodeString *)local_78);
  UVar1 = UnicodeString::isEmpty(prefix);
  if (UVar1 == '\0') {
    (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,prefix,local_78,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      *(char **)nfdPrefix.fUnion._48_8_ = "normalizing the relation prefix";
      nfdString.fUnion._48_4_ = 1;
      goto LAB_0029e008;
    }
  }
  Normalizer2::normalize((UnicodeString *)local_c8,this->nfd,str,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar3 = UnicodeString::length((UnicodeString *)local_c8);
    if (iVar3 < 2) goto LAB_0029db5c;
    cVar2 = UnicodeString::charAt((UnicodeString *)local_c8,0);
    UVar1 = Hangul::isJamoL((uint)(ushort)cVar2);
    if ((UVar1 == '\0') && (UVar1 = Hangul::isJamoV((uint)(ushort)cVar2), UVar1 == '\0')) {
      cVar2 = UnicodeString::charAt((UnicodeString *)local_c8,iVar3 + -1);
      UVar1 = Hangul::isJamoL((uint)(ushort)cVar2);
      if (UVar1 == '\0') {
        UVar1 = Hangul::isJamoV((uint)(ushort)cVar2);
        if (UVar1 != '\0') {
          cVar2 = UnicodeString::charAt((UnicodeString *)local_c8,iVar3 + -2);
          UVar1 = Hangul::isJamoL((uint)(ushort)cVar2);
          if (UVar1 != '\0') goto LAB_0029db36;
        }
LAB_0029db5c:
        if (strength == 0xf) {
LAB_0029dd13:
          setCaseBits(this,(UnicodeString *)local_c8,(char **)nfdPrefix.fUnion._48_8_,errorCode);
          UVar1 = ::U_FAILURE(*errorCode);
          if (UVar1 == '\0') {
            nfdExtension.fUnion._48_4_ = this->cesLength;
            UVar1 = UnicodeString::isEmpty(extension);
            if (UVar1 == '\0') {
              Normalizer2::normalize((UnicodeString *)local_128,this->nfd,extension,errorCode);
              UVar1 = ::U_FAILURE(*errorCode);
              if (UVar1 == '\0') {
                iVar3 = CollationDataBuilder::getCEs
                                  (this->dataBuilder,(UnicodeString *)local_128,this->ces,
                                   this->cesLength);
                this->cesLength = iVar3;
                if (this->cesLength < 0x20) {
                  nfdString.fUnion._48_4_ = 0;
                }
                else {
                  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                  *(char **)nfdPrefix.fUnion._48_8_ =
                       "extension string adds too many collation elements (more than 31 total)";
                  nfdString.fUnion._48_4_ = 1;
                }
              }
              else {
                *(char **)nfdPrefix.fUnion._48_8_ = "normalizing the relation extension";
                nfdString.fUnion._48_4_ = 1;
              }
              UnicodeString::~UnicodeString((UnicodeString *)local_128);
              if (nfdString.fUnion._48_4_ != 0) goto LAB_0029dffc;
            }
            local_12c = 0xffffffff;
            UVar1 = UnicodeString::operator!=(prefix,(UnicodeString *)local_78);
            if (((UVar1 != '\0') ||
                (UVar1 = UnicodeString::operator!=(str,(UnicodeString *)local_c8), UVar1 != '\0'))
               && ((UVar1 = ignorePrefix(this,prefix,errorCode), UVar1 == '\0' &&
                   (UVar1 = ignoreString(this,str,errorCode), UVar1 == '\0')))) {
              local_12c = addIfDifferent(this,prefix,str,this->ces,this->cesLength,0xffffffff,
                                         errorCode);
            }
            addWithClosure(this,(UnicodeString *)local_78,(UnicodeString *)local_c8,this->ces,
                           this->cesLength,local_12c,errorCode);
            UVar1 = ::U_FAILURE(*errorCode);
            if (UVar1 == '\0') {
              this->cesLength = nfdExtension.fUnion._48_4_;
              nfdString.fUnion._48_4_ = 0;
            }
            else {
              *(char **)nfdPrefix.fUnion._48_8_ = "writing collation elements";
              nfdString.fUnion._48_4_ = 1;
            }
          }
          else {
            nfdString.fUnion._48_4_ = 1;
          }
        }
        else {
          iVar3 = findOrInsertNodeForCEs(this,strength,(char **)nfdPrefix.fUnion._48_8_,errorCode);
          iVar4 = this->ces[this->cesLength + -1];
          if (((strength == 0) && (UVar1 = isTempCE(iVar4), UVar1 == '\0')) &&
             ((int)((ulong)iVar4 >> 0x20) == 0)) {
            *errorCode = U_UNSUPPORTED_ERROR;
            *(char **)nfdPrefix.fUnion._48_8_ = "tailoring primary after ignorables not supported";
            nfdString.fUnion._48_4_ = 1;
          }
          else if ((strength == 3) && (iVar4 == 0)) {
            *errorCode = U_UNSUPPORTED_ERROR;
            *(char **)nfdPrefix.fUnion._48_8_ =
                 "tailoring quaternary after tertiary ignorables not supported";
            nfdString.fUnion._48_4_ = 1;
          }
          else {
            iVar3 = insertTailoredNodeAfter(this,iVar3,strength,errorCode);
            UVar1 = ::U_FAILURE(*errorCode);
            if (UVar1 == '\0') {
              nfdExtension.fUnion._52_4_ = ceStrength(iVar4);
              if (strength < (int)nfdExtension.fUnion._52_4_) {
                nfdExtension.fUnion._52_4_ = strength;
              }
              iVar4 = tempCEFromIndexAndStrength(iVar3,nfdExtension.fUnion._52_4_);
              this->ces[this->cesLength + -1] = iVar4;
              goto LAB_0029dd13;
            }
            *(char **)nfdPrefix.fUnion._48_8_ = "modifying collation elements";
            nfdString.fUnion._48_4_ = 1;
          }
        }
      }
      else {
LAB_0029db36:
        *errorCode = U_UNSUPPORTED_ERROR;
        *(char **)nfdPrefix.fUnion._48_8_ =
             "contractions ending with conjoining Jamo L or L+V not supported";
        nfdString.fUnion._48_4_ = 1;
      }
    }
    else {
      *errorCode = U_UNSUPPORTED_ERROR;
      *(char **)nfdPrefix.fUnion._48_8_ =
           "contractions starting with conjoining Jamo L or V not supported";
      nfdString.fUnion._48_4_ = 1;
    }
  }
  else {
    *(char **)nfdPrefix.fUnion._48_8_ = "normalizing the relation string";
    nfdString.fUnion._48_4_ = 1;
  }
LAB_0029dffc:
  UnicodeString::~UnicodeString((UnicodeString *)local_c8);
LAB_0029e008:
  UnicodeString::~UnicodeString((UnicodeString *)local_78);
  return;
}

Assistant:

void
CollationBuilder::addRelation(int32_t strength, const UnicodeString &prefix,
                              const UnicodeString &str, const UnicodeString &extension,
                              const char *&parserErrorReason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    UnicodeString nfdPrefix;
    if(!prefix.isEmpty()) {
        nfd.normalize(prefix, nfdPrefix, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation prefix";
            return;
        }
    }
    UnicodeString nfdString = nfd.normalize(str, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "normalizing the relation string";
        return;
    }

    // The runtime code decomposes Hangul syllables on the fly,
    // with recursive processing but without making the Jamo pieces visible for matching.
    // It does not work with certain types of contextual mappings.
    int32_t nfdLength = nfdString.length();
    if(nfdLength >= 2) {
        UChar c = nfdString.charAt(0);
        if(Hangul::isJamoL(c) || Hangul::isJamoV(c)) {
            // While handling a Hangul syllable, contractions starting with Jamo L or V
            // would not see the following Jamo of that syllable.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions starting with conjoining Jamo L or V not supported";
            return;
        }
        c = nfdString.charAt(nfdLength - 1);
        if(Hangul::isJamoL(c) ||
                (Hangul::isJamoV(c) && Hangul::isJamoL(nfdString.charAt(nfdLength - 2)))) {
            // A contraction ending with Jamo L or L+V would require
            // generating Hangul syllables in addTailComposites() (588 for a Jamo L),
            // or decomposing a following Hangul syllable on the fly, during contraction matching.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions ending with conjoining Jamo L or L+V not supported";
            return;
        }
        // A Hangul syllable completely inside a contraction is ok.
    }
    // Note: If there is a prefix, then the parser checked that
    // both the prefix and the string beging with NFC boundaries (not Jamo V or T).
    // Therefore: prefix.isEmpty() || !isJamoVOrT(nfdString.charAt(0))
    // (While handling a Hangul syllable, prefixes on Jamo V or T
    // would not see the previous Jamo of that syllable.)

    if(strength != UCOL_IDENTICAL) {
        // Find the node index after which we insert the new tailored node.
        int32_t index = findOrInsertNodeForCEs(strength, parserErrorReason, errorCode);
        U_ASSERT(cesLength > 0);
        int64_t ce = ces[cesLength - 1];
        if(strength == UCOL_PRIMARY && !isTempCE(ce) && (uint32_t)(ce >> 32) == 0) {
            // There is no primary gap between ignorables and the space-first-primary.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring primary after ignorables not supported";
            return;
        }
        if(strength == UCOL_QUATERNARY && ce == 0) {
            // The CE data structure does not support non-zero quaternary weights
            // on tertiary ignorables.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring quaternary after tertiary ignorables not supported";
            return;
        }
        // Insert the new tailored node.
        index = insertTailoredNodeAfter(index, strength, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "modifying collation elements";
            return;
        }
        // Strength of the temporary CE:
        // The new relation may yield a stronger CE but not a weaker one.
        int32_t tempStrength = ceStrength(ce);
        if(strength < tempStrength) { tempStrength = strength; }
        ces[cesLength - 1] = tempCEFromIndexAndStrength(index, tempStrength);
    }

    setCaseBits(nfdString, parserErrorReason, errorCode);
    if(U_FAILURE(errorCode)) { return; }

    int32_t cesLengthBeforeExtension = cesLength;
    if(!extension.isEmpty()) {
        UnicodeString nfdExtension = nfd.normalize(extension, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation extension";
            return;
        }
        cesLength = dataBuilder->getCEs(nfdExtension, ces, cesLength);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            parserErrorReason =
                "extension string adds too many collation elements (more than 31 total)";
            return;
        }
    }
    uint32_t ce32 = Collation::UNASSIGNED_CE32;
    if((prefix != nfdPrefix || str != nfdString) &&
            !ignorePrefix(prefix, errorCode) && !ignoreString(str, errorCode)) {
        // Map from the original input to the CEs.
        // We do this in case the canonical closure is incomplete,
        // so that it is possible to explicitly provide the missing mappings.
        ce32 = addIfDifferent(prefix, str, ces, cesLength, ce32, errorCode);
    }
    addWithClosure(nfdPrefix, nfdString, ces, cesLength, ce32, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "writing collation elements";
        return;
    }
    cesLength = cesLengthBeforeExtension;
}